

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

uint GetArgumentOffset(FunctionData *data,uint argument)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  
  if (argument == 0) {
    uVar1 = 0;
  }
  else {
    if ((data->arguments).count <= argument - 1) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                   );
    }
    lVar2 = 0;
    uVar1 = 0;
    do {
      iVar3 = *(int *)(*(long *)((long)&((data->arguments).data)->type + lVar2) + 0x30);
      if (iVar3 - 1U < 3) {
        iVar3 = 4;
      }
      uVar1 = uVar1 + iVar3;
      lVar2 = lVar2 + 0x30;
    } while ((ulong)argument * 0x30 != lVar2);
  }
  return uVar1;
}

Assistant:

unsigned GetArgumentOffset(FunctionData *data, unsigned argument)
{
	// Start at context
	unsigned offset = 0;

	for(unsigned i = 0; i < argument; i++)
	{
		unsigned size = unsigned(data->arguments[i].type->size);

		if(size != 0 && size < 4)
			size = 4;

		offset += size;
	}

	return offset;
}